

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5fce8::CtorEvalExternalInterface::importGlobals
          (CtorEvalExternalInterface *this,GlobalValueSet *globals,Module *wasm_)

{
  _Rb_tree_header *__x;
  _Base_ptr __y;
  Global *__k;
  _Base_ptr p_Var1;
  bool bVar2;
  iterator iVar3;
  long lVar4;
  key_type *__k_00;
  SmallVector<wasm::Literal,_1UL> *other;
  SmallVector<wasm::Literal,_1UL> *this_00;
  string *psVar5;
  Name *in_RCX;
  pointer puVar6;
  Name NVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  pointer local_50;
  CtorEvalExternalInterface *local_48;
  GlobalValueSet *local_40;
  allocator<char> local_31;
  
  puVar6 = (wasm_->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_50 = (wasm_->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  __x = &(this->linkedInstances)._M_t._M_impl.super__Rb_tree_header;
  local_48 = this;
  local_40 = globals;
  do {
    if (puVar6 == local_50) {
      return;
    }
    __k = (puVar6->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
          _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
          super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    if (*(char **)((long)&(__k->super_Importable).module + 8) != (char *)0x0) {
      __y = (_Base_ptr)&(__k->super_Importable).module;
      iVar3 = std::
              _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
              ::_M_lower_bound((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<(anonymous_namespace)::EvallingModuleRunner>_>_>_>
                                *)(local_48->linkedInstances)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,(_Link_type)__x,__y,in_RCX);
      if ((_Rb_tree_header *)iVar3._M_node == __x) {
LAB_001368c1:
        psVar5 = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"importGlobals: ",&local_31);
        wasm::IString::toString_abi_cxx11_(&local_90,(IString *)__y);
        std::operator+(&local_d0,&local_b0,&local_90);
        std::operator+(&local_f0,&local_d0,".");
        wasm::IString::toString_abi_cxx11_(&local_70,&(__k->super_Importable).base.super_IString);
        std::operator+(&local_110,&local_f0,&local_70);
        std::__cxx11::string::string(psVar5,(string *)&local_110);
        __cxa_throw(psVar5,&(anonymous_namespace)::FailToEvalException::typeinfo,
                    FailToEvalException::~FailToEvalException);
      }
      bVar2 = wasm::IString::operator<((IString *)__y,(IString *)(iVar3._M_node + 1));
      if (bVar2) goto LAB_001368c1;
      p_Var1 = iVar3._M_node[1]._M_left;
      NVar7.super_IString.str._M_str = *(char **)&(__k->super_Importable).base.super_IString.str;
      NVar7.super_IString.str._M_len = *(size_t *)(p_Var1 + 1);
      lVar4 = wasm::Module::getExportOrNull(NVar7);
      if ((lVar4 == 0) || (*(int *)(lVar4 + 0x10) != 3)) {
        psVar5 = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"importGlobals: ",&local_31);
        wasm::IString::toString_abi_cxx11_(&local_90,(IString *)__y);
        std::operator+(&local_d0,&local_b0,&local_90);
        std::operator+(&local_f0,&local_d0,".");
        wasm::IString::toString_abi_cxx11_(&local_70,&(__k->super_Importable).base.super_IString);
        std::operator+(&local_110,&local_f0,&local_70);
        std::__cxx11::string::string(psVar5,(string *)&local_110);
        __cxa_throw(psVar5,&(anonymous_namespace)::FailToEvalException::typeinfo,
                    FailToEvalException::~FailToEvalException);
      }
      if (*(char *)(lVar4 + 0x28) == '\0') {
        __k_00 = (key_type *)(lVar4 + 0x18);
      }
      else {
        __k_00 = (key_type *)0x0;
      }
      other = &std::
               map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
               ::operator[]((map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
                             *)&p_Var1[1]._M_parent,__k_00)->super_SmallVector<wasm::Literal,_1UL>;
      this_00 = &std::
                 map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
                 ::operator[](local_40,(key_type *)__k)->super_SmallVector<wasm::Literal,_1UL>;
      wasm::SmallVector<wasm::Literal,_1UL>::operator=(this_00,other);
    }
    puVar6 = puVar6 + 1;
  } while( true );
}

Assistant:

void importGlobals(GlobalValueSet& globals, Module& wasm_) override {
    ModuleUtils::iterImportedGlobals(wasm_, [&](Global* global) {
      auto it = linkedInstances.find(global->module);
      if (it != linkedInstances.end()) {
        auto* inst = it->second.get();
        auto* globalExport = inst->wasm.getExportOrNull(global->base);
        if (!globalExport || globalExport->kind != ExternalKind::Global) {
          throw FailToEvalException(std::string("importGlobals: ") +
                                    global->module.toString() + "." +
                                    global->base.toString());
        }
        globals[global->name] = inst->globals[*globalExport->getInternalName()];
      } else {
        throw FailToEvalException(std::string("importGlobals: ") +
                                  global->module.toString() + "." +
                                  global->base.toString());
      }
    });
  }